

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

bool __thiscall
chrono::ChEnumMapper<chrono::ChSolver::Type>::SetValueAsString
          (ChEnumMapper<chrono::ChSolver::Type> *this,string *mname)

{
  vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>
  *this_00;
  __type_conflict _Var1;
  reference pvVar2;
  ulong __n;
  bool bVar3;
  int numb;
  istringstream mstream;
  byte abStack_188 [352];
  
  __n = 0xffffffffffffffff;
  do {
    this_00 = (this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    __n = __n + 1;
    if ((ulong)(((long)(this_00->
                       super__Vector_base<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->
                      super__Vector_base<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x28) <= __n) {
      std::__cxx11::istringstream::istringstream((istringstream *)&mstream,(string *)mname,_S_in);
      std::istream::operator>>((istringstream *)&mstream,&numb);
      bVar3 = (abStack_188[*(long *)(_mstream + -0x18)] & 5) == 0;
      if (bVar3) {
        (*(this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase[1])(this,(ulong)(uint)numb);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&mstream);
      return bVar3;
    }
    pvVar2 = std::
             vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>
             ::at(this_00,__n);
    _Var1 = std::operator==(&pvVar2->name,mname);
  } while (!_Var1);
  pvVar2 = std::
           vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>
           ::at((this->enummap).
                super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,__n);
  *this->value_ptr = pvVar2->enumid;
  return true;
}

Assistant:

virtual bool SetValueAsString(const std::string& mname) override {
        for (int i = 0; i < enummap->size(); ++i) {
            if (enummap->at(i).name == mname) {
                *value_ptr = enummap->at(i).enumid;
                return true;
            }
        }
        // try to find from integer:
        int numb;
        std::istringstream mstream(mname);
        mstream >> numb;
        if (mstream.fail())
            return false;

        // Set value from number
        SetValueAsInt(numb);
        return true;
    }